

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::PropertyCaseItemSyntax::isKind(SyntaxKind kind)

{
  return kind == StandardPropertyCaseItem || kind == DefaultPropertyCaseItem;
}

Assistant:

bool PropertyCaseItemSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultPropertyCaseItem:
        case SyntaxKind::StandardPropertyCaseItem:
            return true;
        default:
            return false;
    }
}